

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

bc_slist_t * bc_slist_append_list(bc_slist_t *l,bc_slist_t *n)

{
  bc_slist_t *local_28;
  bc_slist_t *tmp;
  bc_slist_t *n_local;
  bc_slist_t *l_local;
  
  l_local = n;
  if ((l != (bc_slist_t *)0x0) && (local_28 = l, l_local = l, n != (bc_slist_t *)0x0)) {
    for (; local_28->next != (_bc_slist_t *)0x0; local_28 = local_28->next) {
    }
    local_28->next = n;
  }
  return l_local;
}

Assistant:

bc_slist_t*
bc_slist_append_list(bc_slist_t *l, bc_slist_t *n)
{
    if (l == NULL) {
        return n;
    }
    if (n == NULL) {
        return l;
    }
    bc_slist_t *tmp;
    for (tmp = l; tmp->next != NULL; tmp = tmp->next);
    tmp->next = n;
    return l;
}